

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void __thiscall VmFunction::DetachBlock(VmFunction *this,VmBlock *block)

{
  VmBlock *block_local;
  VmFunction *this_local;
  
  if (block == (VmBlock *)0x0) {
    __assert_fail("block",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x837,"void VmFunction::DetachBlock(VmBlock *)");
  }
  if (block->parent == this) {
    if (block == this->firstBlock) {
      this->firstBlock = block->nextSibling;
    }
    if (block == this->lastBlock) {
      this->lastBlock = block->prevSibling;
    }
    if (block->prevSibling != (VmBlock *)0x0) {
      block->prevSibling->nextSibling = block->nextSibling;
    }
    if (block->nextSibling != (VmBlock *)0x0) {
      block->nextSibling->prevSibling = block->prevSibling;
    }
    block->parent = (VmFunction *)0x0;
    block->prevSibling = (VmBlock *)0x0;
    block->nextSibling = (VmBlock *)0x0;
    return;
  }
  __assert_fail("block->parent == this",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x838,"void VmFunction::DetachBlock(VmBlock *)");
}

Assistant:

void VmFunction::DetachBlock(VmBlock *block)
{
	assert(block);
	assert(block->parent == this);

	if(block == firstBlock)
		firstBlock = block->nextSibling;

	if(block == lastBlock)
		lastBlock = block->prevSibling;

	if(block->prevSibling)
		block->prevSibling->nextSibling = block->nextSibling;
	if(block->nextSibling)
		block->nextSibling->prevSibling = block->prevSibling;

	block->parent = NULL;
	block->prevSibling = NULL;
	block->nextSibling = NULL;
}